

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::PackedArrays::resize_array(PackedArrays *this,index_t array_index,index_t array_size,bool lock)

{
  bool bVar1;
  index_t *piVar2;
  uint local_ac;
  allocator local_89;
  index_t nb_in_ZV;
  allocator local_51;
  string local_50 [36];
  index_t local_2c;
  index_t *piStack_28;
  index_t old_array_size;
  index_t *array_base;
  index_t local_18;
  index_t iStack_14;
  bool lock_local;
  index_t array_size_local;
  index_t array_index_local;
  PackedArrays *this_local;
  
  array_base._7_1_ = lock;
  local_18 = array_size;
  iStack_14 = array_index;
  _array_size_local = this;
  if (lock) {
    lock_array(this,array_index);
  }
  piStack_28 = this->Z1_ + iStack_14 * this->Z1_stride_;
  local_2c = *piStack_28;
  if (local_2c != local_18) {
    *piStack_28 = local_18;
    bVar1 = static_mode(this);
    if (bVar1) {
      if (this->Z1_block_size_ < local_18) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_50,"array_size <= Z1_block_size_",&local_51);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&nb_in_ZV,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                   ,&local_89);
        geo_assertion_failed((string *)local_50,(string *)&nb_in_ZV,0x1842);
      }
    }
    else {
      if (this->Z1_block_size_ < local_18) {
        local_ac = local_18 - this->Z1_block_size_;
      }
      else {
        local_ac = 0;
      }
      piVar2 = (index_t *)realloc(this->ZV_[iStack_14],(ulong)local_ac << 2);
      this->ZV_[iStack_14] = piVar2;
    }
  }
  if ((array_base._7_1_ & 1) != 0) {
    unlock_array(this,iStack_14);
  }
  return;
}

Assistant:

void PackedArrays::resize_array(
        index_t array_index, index_t array_size, bool lock
    ) {
        geo_debug_assert(array_index < nb_arrays_);
        if(lock) {
            lock_array(array_index);
        }
        index_t* array_base = Z1_ + array_index * Z1_stride_;
        index_t old_array_size = *array_base;
        if(old_array_size != array_size) {
            *array_base = array_size;
            if(static_mode()) {
                geo_assert(array_size <= Z1_block_size_);
            } else {
                index_t nb_in_ZV =
                    (array_size > Z1_block_size_) ?
                    array_size - Z1_block_size_ : 0;
                ZV_[array_index] = (index_t*) realloc(
                    ZV_[array_index], sizeof(index_t) * nb_in_ZV
                );
            }
        }
        if(lock) {
            unlock_array(array_index);
        }
    }